

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readthis.cpp
# Opt level: O1

void __thiscall DReadThisMenu::Drawer(DReadThisMenu *this)

{
  char *texname;
  FTextureID FVar1;
  FTexture *img;
  FTexture *img_00;
  double dVar2;
  
  if ((level.info == (level_info_t *)0x0) ||
     (texname = ((level.info)->F1Pic).Chars, *(int *)(texname + -0xc) == 0)) {
    img = (FTexture *)0x0;
  }
  else {
    img = FTextureManager::FindTexture(&TexMan,texname,8,1);
    this->mScreen = 1;
  }
  if (img == (FTexture *)0x0) {
    img = (FTexture *)0x0;
    FVar1 = FTextureManager::GetTexture
                      (&TexMan,FName::NameData.NameArray
                               [gameinfo.infoPages.Array[(long)this->mScreen + -1].Index].Text,8,0);
    if (-1 < FVar1.texnum) {
      img = TexMan.Textures.Array[(uint)FVar1.texnum].Texture;
    }
  }
  if ((long)this->mScreen < 2) {
    img_00 = (FTexture *)0x0;
  }
  else {
    img_00 = (FTexture *)0x0;
    FVar1 = FTextureManager::GetTexture
                      (&TexMan,FName::NameData.NameArray
                               [gameinfo.infoPages.Array[(long)this->mScreen + -2].Index].Text,8,0);
    if (-1 < FVar1.texnum) {
      img_00 = TexMan.Textures.Array[(uint)FVar1.texnum].Texture;
    }
  }
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
            (0x3f800000,screen,0,0,0,(ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
             (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Height);
  dVar2 = (double)(gametic - this->mInfoTic) * 0.08571428571428572;
  if (1.0 <= dVar2) {
    dVar2 = 1.0;
  }
  if ((img_00 != (FTexture *)0x0) && (dVar2 < 1.0)) {
    DCanvas::DrawTexture((DCanvas *)screen,img_00,0.0,0.0,0x400013ae,1,0);
  }
  DCanvas::DrawTexture((DCanvas *)screen,img,0.0,0.0,0x400013ae,dVar2,1,0x4000138c,0);
  return;
}

Assistant:

void DReadThisMenu::Drawer()
{
	FTexture *tex = NULL, *prevpic = NULL;
	double alpha;

	// Did the mapper choose a custom help page via MAPINFO?
	if ((level.info != NULL) && level.info->F1Pic.Len() != 0)
	{
		tex = TexMan.FindTexture(level.info->F1Pic);
		mScreen = 1;
	}
	
	if (tex == NULL)
	{
		tex = TexMan[gameinfo.infoPages[mScreen-1].GetChars()];
	}

	if (mScreen > 1)
	{
		prevpic = TexMan[gameinfo.infoPages[mScreen-2].GetChars()];
	}

	screen->Dim(0, 1.0, 0,0, SCREENWIDTH, SCREENHEIGHT);
	alpha = MIN((gametic - mInfoTic) * (3. / TICRATE), 1.);
	if (alpha < 1. && prevpic != NULL)
	{
		screen->DrawTexture (prevpic, 0, 0, DTA_Fullscreen, true, TAG_DONE);
	}
	screen->DrawTexture (tex, 0, 0, DTA_Fullscreen, true, DTA_AlphaF, alpha,	TAG_DONE);

}